

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTessellation.cpp
# Opt level: O1

bool __thiscall
glcts::TessellationShaderTessellationMaxInOut::compareValues
          (TessellationShaderTessellationMaxInOut *this,char *description,GLfloat *reference_values,
          int n_reference_values)

{
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  float *pfVar4;
  ulong uVar5;
  size_t sVar6;
  long lVar7;
  bool bVar8;
  float fVar9;
  float fVar10;
  undefined1 local_1b0 [8];
  _func_int **local_1a8;
  ios_base local_138 [264];
  long lVar3;
  
  iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  pfVar4 = (float *)(**(code **)(lVar3 + 0xd00))(0x8c8e,0,(long)(n_reference_values << 5),1);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glMapBufferRange() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0xb29);
  bVar8 = n_reference_values << 2 < 1;
  if (0 < n_reference_values << 2) {
    fVar9 = *pfVar4 - *reference_values;
    fVar10 = -fVar9;
    if (-fVar9 <= fVar9) {
      fVar10 = fVar9;
    }
    if (fVar10 <= 1e-05) {
      uVar5 = 4;
      lVar7 = 0;
      do {
        fVar9 = pfVar4[uVar5 - 3] - reference_values[uVar5 - 3];
        fVar10 = -fVar9;
        if (-fVar9 <= fVar9) {
          fVar10 = fVar9;
        }
        if (1e-05 < fVar10) goto LAB_00d5ba87;
        fVar9 = pfVar4[uVar5 - 2] - reference_values[uVar5 - 2];
        fVar10 = -fVar9;
        if (-fVar9 <= fVar9) {
          fVar10 = fVar9;
        }
        if (1e-05 < fVar10) goto LAB_00d5ba87;
        fVar9 = pfVar4[uVar5 - 1] - reference_values[uVar5 - 1];
        fVar10 = -fVar9;
        if (-fVar9 <= fVar9) {
          fVar10 = fVar9;
        }
        if (1e-05 < fVar10) break;
        bVar8 = (uint)(n_reference_values << 2) <= uVar5;
        if (bVar8) goto LAB_00d5bca2;
        fVar9 = pfVar4[uVar5] - reference_values[uVar5];
        fVar10 = -fVar9;
        if (-fVar9 <= fVar9) {
          fVar10 = fVar9;
        }
        uVar5 = uVar5 + 4;
        lVar7 = lVar7 + 4;
      } while (fVar10 <= 1e-05);
      lVar7 = uVar5 - 4;
    }
    else {
      lVar7 = 0;
    }
LAB_00d5ba87:
    local_1b0 = (undefined1  [8])
                ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    if (description == (char *)0x0) {
      std::ios::clear((int)(ostringstream *)&local_1a8 + (int)local_1a8[-3]);
    }
    else {
      sVar6 = strlen(description);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,description,sVar6);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,": captured results ",0x13);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"vec4(",5);
    std::ostream::_M_insert<double>((double)pfVar4[lVar7]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", ",2);
    iVar1 = (int)lVar7;
    std::ostream::_M_insert<double>((double)pfVar4[(long)iVar1 | 1U]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", ",2);
    std::ostream::_M_insert<double>((double)pfVar4[(long)iVar1 | 2U]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", ",2);
    std::ostream::_M_insert<double>((double)pfVar4[(long)iVar1 | 3U]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,") ",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"are different from the expected values ",0x27);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"vec4(",5);
    std::ostream::_M_insert<double>((double)reference_values[lVar7]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", ",2);
    std::ostream::_M_insert<double>((double)reference_values[(long)iVar1 | 1U]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", ",2);
    std::ostream::_M_insert<double>((double)reference_values[(long)iVar1 | 2U]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", ",2);
    std::ostream::_M_insert<double>((double)reference_values[(long)iVar1 | 3U]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,").",2);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    std::ios_base::~ios_base(local_138);
  }
LAB_00d5bca2:
  (**(code **)(lVar3 + 0x1670))(0x8c8e);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glUnmapBuffer() failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0xb44);
  return bVar8;
}

Assistant:

bool TessellationShaderTessellationMaxInOut::compareValues(char const* description, glw::GLfloat* reference_values,
														   int n_reference_values)
{
	/* Retrieve ES entry-points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Map the buffer storage into process space. */
	glw::GLint bo_size = static_cast<glw::GLint>(2 /* number of vertices */ * sizeof(glw::GLfloat) *
												 n_reference_values * 4); /* number of components */
	glw::GLfloat* resultFloats =
		(glw::GLfloat*)gl.mapBufferRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0, bo_size, GL_MAP_READ_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBufferRange() failed");

	/* Verify the data */
	const glw::GLfloat epsilon	 = (glw::GLfloat)1e-5f;
	bool			   test_passed = true;

	for (int i = 0; i < n_reference_values * 4 /* number of components */; i += 4 /* number of components */)
	{
		if ((de::abs(resultFloats[i] - reference_values[i]) > epsilon) ||
			(de::abs(resultFloats[i + 1] - reference_values[i + 1]) > epsilon) ||
			(de::abs(resultFloats[i + 2] - reference_values[i + 2]) > epsilon) ||
			(de::abs(resultFloats[i + 3] - reference_values[i + 3]) > epsilon))
		{
			m_testCtx.getLog() << tcu::TestLog::Message << description << ": captured results "
							   << "vec4(" << resultFloats[i + 0] << ", " << resultFloats[i + 1] << ", "
							   << resultFloats[i + 2] << ", " << resultFloats[i + 3] << ") "
							   << "are different from the expected values "
							   << "vec4(" << reference_values[i + 0] << ", " << reference_values[i + 1] << ", "
							   << reference_values[i + 2] << ", " << reference_values[i + 3] << ")."
							   << tcu::TestLog::EndMessage;

			test_passed = false;
			break;
		}
	}

	gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer() failed!");

	return test_passed;
}